

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_EvaluateBezier(int dim,bool is_rat,int order,int cv_stride,double *cv,double t0,double t1,
                      int der_count,double t,int v_stride,double *v)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  ulong sz;
  double dVar4;
  double dVar5;
  int local_8bc;
  double *local_8b8;
  int local_8ac;
  size_t sizeofCV;
  int cvdim;
  int degree;
  void *free_me;
  double *tmp;
  double *CV;
  int local_878;
  int k;
  int j;
  int i;
  double *cv1;
  double *cv0;
  double alpha1;
  double alpha0;
  double delta_t;
  uchar stack_buffer [2048];
  double t_local;
  int der_count_local;
  double t1_local;
  double t0_local;
  double *cv_local;
  int cv_stride_local;
  int order_local;
  bool is_rat_local;
  int dim_local;
  
  _cvdim = (double *)0x0;
  iVar3 = order + -1;
  local_8ac = dim;
  if (is_rat) {
    local_8ac = dim + 1;
  }
  cv_local._4_4_ = cv_stride;
  if (cv_stride < local_8ac) {
    cv_local._4_4_ = local_8ac;
  }
  stack_buffer._2040_8_ = t;
  memset(v,0,(long)(v_stride * (der_count + 1)) << 3);
  if ((t0 != t1) || (NAN(t0) || NAN(t1))) {
    local_878 = 0;
    t_local._4_4_ = der_count;
    if ((iVar3 < der_count) && (t_local._4_4_ = iVar3, is_rat)) {
      local_878 = (der_count - iVar3) * local_8ac;
      t_local._4_4_ = der_count;
    }
    sz = (long)(order * local_8ac + local_878) << 3;
    if (sz < 0x801) {
      local_8b8 = &delta_t;
    }
    else {
      local_8b8 = (double *)onmalloc(sz);
      _cvdim = local_8b8;
    }
    if (local_878 != 0) {
      memset(local_8b8 + order * local_8ac,0,(long)local_878 << 3);
    }
    cv1 = local_8b8;
    if (((t0 == (double)stack_buffer._2040_8_) && (!NAN(t0) && !NAN((double)stack_buffer._2040_8_)))
       || (((double)stack_buffer._2040_8_ <= (t0 + t1) * 0.5 &&
           (((double)stack_buffer._2040_8_ != t1 || (NAN((double)stack_buffer._2040_8_) || NAN(t1)))
           )))) {
      t0_local = (double)cv;
      for (k = 0; k < order; k = k + 1) {
        memcpy(cv1,(void *)t0_local,(long)local_8ac << 3);
        cv1 = cv1 + local_8ac;
        t0_local = (double)((long)t0_local + (long)cv_local._4_4_ * 8);
      }
      t0_local = (double)((long)t0_local + (long)(cv_local._4_4_ * order) * -8);
      dVar5 = t1 - (double)stack_buffer._2040_8_;
      dVar4 = 1.0 / (t1 - t0);
      alpha1 = (t1 - (double)stack_buffer._2040_8_) * dVar4;
      cv0 = (double *)(((double)stack_buffer._2040_8_ - t0) * dVar4);
    }
    else {
      t0_local = (double)(cv + cv_local._4_4_ * order);
      CV._4_4_ = order;
      while (CV._4_4_ != 0) {
        t0_local = (double)((long)t0_local + (long)cv_local._4_4_ * -8);
        memcpy(cv1,(void *)t0_local,(long)local_8ac << 3);
        cv1 = cv1 + local_8ac;
        CV._4_4_ = CV._4_4_ + -1;
      }
      dVar5 = t0 - (double)stack_buffer._2040_8_;
      dVar4 = 1.0 / (t1 - t0);
      cv0 = (double *)((t1 - (double)stack_buffer._2040_8_) * dVar4);
      alpha1 = ((double)stack_buffer._2040_8_ - t0) * dVar4;
    }
    alpha0 = 1.0 / dVar5;
    local_878 = order;
    if (((double)cv0 != 0.0) || (NAN((double)cv0))) {
      while (local_878 = local_878 + -1, local_878 != 0) {
        cv1 = local_8b8;
        _j = local_8b8 + local_8ac;
        k = local_878;
        while (iVar3 = k + -1, k != 0) {
          CV._4_4_ = local_8ac;
          while (k = iVar3, CV._4_4_ != 0) {
            *cv1 = *cv1 * alpha1 + *_j * (double)cv0;
            cv1 = cv1 + 1;
            _j = _j + 1;
            CV._4_4_ = CV._4_4_ + -1;
          }
        }
      }
    }
    if ((((!is_rat) || (local_8b8[dim] != 0.0)) || (NAN(local_8b8[dim]))) ||
       (bVar2 = ON_RemoveBezierSingAt0(dim,order,local_8ac,local_8b8), bVar2)) {
      if (t_local._4_4_ != 0) {
        alpha1 = (double)order;
        local_8bc = order;
        if (t_local._4_4_ < order) {
          local_8bc = t_local._4_4_ + 1;
        }
        local_878 = local_8bc;
        while (local_878 = local_878 + -1, local_878 != 0) {
          alpha1 = alpha1 - 1.0;
          cv1 = local_8b8 + local_8ac * local_8bc + -(long)local_8ac;
          k = local_878;
          _j = local_8b8 + local_8ac * local_8bc;
          while (iVar3 = k + -1, k != 0) {
            CV._4_4_ = local_8ac;
            while (k = iVar3, CV._4_4_ != 0) {
              cv1 = cv1 + -1;
              _j = _j + -1;
              *_j = alpha1 * alpha0 * (*_j - *cv1);
              CV._4_4_ = CV._4_4_ + -1;
            }
          }
        }
      }
      tmp = local_8b8;
      if (order == 2) {
        local_878 = cv_local._4_4_;
        for (k = 0; k < local_8ac; k = k + 1) {
          dVar4 = *(double *)((long)t0_local + (long)k * 8);
          pdVar1 = (double *)((long)t0_local + (long)local_878 * 8);
          if ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1))) {
            local_8b8[k] = *(double *)((long)t0_local + (long)k * 8);
          }
          local_878 = local_878 + 1;
        }
      }
      if (is_rat) {
        ON_EvaluateQuotientRule(dim,t_local._4_4_,local_8ac,local_8b8);
      }
      for (k = 0; k <= t_local._4_4_; k = k + 1) {
        memcpy(v,tmp,(long)dim << 3);
        v = v + v_stride;
        tmp = tmp + local_8ac;
      }
      if (_cvdim != (double *)0x0) {
        onfree(_cvdim);
      }
      is_rat_local = true;
    }
    else {
      if (_cvdim != (double *)0x0) {
        onfree(_cvdim);
      }
      is_rat_local = false;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_evaluate_nurbs.cpp"
               ,0x21e,"","Invalid domain");
    is_rat_local = false;
  }
  return is_rat_local;
}

Assistant:

bool ON_EvaluateBezier(
                int dim,              // dimension
                bool is_rat,          // true if NURBS is rational
                int order,            // order
                int cv_stride,        // cv_stride >= (is_rat)?dim+1:dim
                const double* cv,     // cv[order*cv_stride] array
                double t0, double t1, // domain
                int der_count,        // number of derivatives to compute
                double t,             // evaluation parameter
                int v_stride,         // v_stride (>=dimension)
                double* v             // v[(der_count+1)*v_stride] array
                )
/*****************************************************************************
Evaluate a Bezier
 
INPUT:
  dim
    (>= 1) dimension of Bezier's range
  is_rat
    0: bezier is not rational
    1: bezier is rational
  order
    (>= 2) (order = degree+1)
  cv
    array of (dim+is_rat)*order doubles that define the
    Bezier's control vertices.
  t0, t1  (t0 != t1)
    Bezier's domain.   Mathematically, Beziers have domain [0,1].  In practice
    Beziers are frequently evaluated at (t-t0)/(t1-t0) and the chain
    rule is used to evaluate the derivatives.  This function is the most
    efficient place to apply the chain rule.
  t
    Evaluation parameter
  der_count
    (>= 0)  number of derivatives to evaluate
  answer
     answer[i] is nullptr or points to an array of dim doubles.
OUTPUT:
  ON_EvBezier()
    0: successful
   -1: failure - rational function had nonzero numerator and zero
                 denominator
  answer
     bez(t)   = answer[0]
     bez'(t)  = answer[1]
              ...
        (n)
     bez  (t) = answer[n]
COMMENTS:
  Use de Casteljau's algorithm.  Rational functions with removable singularities
  (like x^2/x) are efficiently and correctly handled.
EXAMPLE:
  // ...
REFERENCE:
  AUTHOR page ?
RELATED FUNCTIONS:
  ON_EvaluatedeCasteljau
  ON_EvQuotientRule
  ON_EvNurb
  ON_EvPolynomialPoint
  ON_onvertBezierToPolynomial
  ON_onvertPolynomialToBezier
  ON_onvertNurbToBezier
*****************************************************************************/
{
  unsigned char stack_buffer[4*64*sizeof(double)];
  double delta_t;
  double alpha0;
  double alpha1;
  double *cv0, *cv1;
  int i, j, k; 
  double* CV, *tmp;
  void* free_me = 0;
  const int degree = order-1;
  const int cvdim = (is_rat)?dim+1:dim;

  if ( cv_stride < cvdim )
    cv_stride = cvdim;

  memset( v, 0, v_stride*(der_count+1)*sizeof(*v) );


  if (!(t0!=t1)) 
  {
    // Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-28304
    //  This test for valid domain was being done only in debug builds
    //  and not in release builds.  The #if defined(ON_DEBUG) projection
    //  has been here since 2005 when we switched to svn.
    //  I can't determine when or why it got added because it happened
    //  when we used SourceSafe or earlier version control.
    //  The bug was a crash in release builds, which skipped this test.
    //  I'm enabling the test in all builds and addeing a call to ON_ERROR().
    ON_ERROR("Invalid domain");
    return false;
  }

  i = order*cvdim;
  j = 0;
  if (der_count > degree) {
    if (is_rat)
      j = (der_count-degree)*cvdim;
    else {
      der_count = degree;
    }    
  }

  size_t sizeofCV = (i+j)*sizeof(*CV);

  CV = (double*)( (sizeofCV <= sizeof(stack_buffer)) ? stack_buffer : (free_me=onmalloc(sizeofCV)) );
  if (j) {
    memset( CV+i, 0, j*sizeof(*CV) );
  }
  cv0=CV;
  if (    t0 == t 
       || (t <= 0.5*(t0+t1) && t != t1) 
     ) 
  {
    for ( i = 0; i < order; i++ ) 
    {
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
      cv += cv_stride;
    }
    cv -= (cv_stride*order);
    delta_t = 1.0/(t1 - t);
    alpha1 = 1.0/(t1-t0);
    alpha0 = (t1-t)*alpha1;
    alpha1 *= t-t0;
  }
  else 
  {
    cv += (cv_stride*order);
    k=order;
    while(k--) 
    {
      cv -= cv_stride; 
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
    }
    delta_t = 1.0/(t0 - t);
    alpha0 = 1.0/(t1-t0);
    alpha1 = (t1-t)*alpha0;
    alpha0 *= t-t0;
  }

  /* deCasteljau (from the right) */
  if (alpha1 != 0.0) {
    j = order; while (--j) {
      cv0 = CV;
      cv1 = cv0 + cvdim;
      i = j; while (i--) {
        k = cvdim; 
        while (k--) {
          *cv0 = *cv0 * alpha0 + *cv1 * alpha1; 
          cv0++; 
          cv1++;
        }
      }
    }
  }
  
  /* check for removable singularity */
  if (is_rat && CV[dim] == 0.0)
  {
    if ( !ON_RemoveBezierSingAt0(dim,order,cvdim,CV) )
    {
      if ( free_me )
        onfree(free_me);  
      return false;
    }
  }

  /* Lee (from the right) */
  if (der_count) { 
    tmp=CV;
    alpha0 = order;
    j = (der_count>=order)?order:der_count+1;
    CV += cvdim*j; while(--j) {
      alpha0 -= 1.0; cv1 = CV; cv0 = cv1-cvdim;
      i=j; while(i--) {
        alpha1 = alpha0 * delta_t;
        k=cvdim; while(k--) {
          cv0--; 
          cv1--; 
          *cv1 = alpha1*(*cv1 - *cv0);
        }
      }
    }
    CV=tmp;
  }

  if ( 2 == order )
  {
    // 7 January 2004  Dale Lear
    //    Added to fix those cases when, numerically, t*a + (1.0-t)*a != a.
    //    Similar to fix for RR 9683.
    j = cv_stride;
    for ( i = 0; i < cvdim; i++, j++ )
    {
      if ( cv[i] == cv[j] )
      {
        CV[i] = cv[i];
      }
    }
  }

  if (is_rat) {
    ON_EvaluateQuotientRule( dim, der_count, cvdim, CV );
  }

  for (i=0;i<=der_count;i++) {
    memcpy( v, CV, dim*sizeof(*v) );
    v += v_stride;
    CV += cvdim;
  }

  if ( free_me )
    onfree(free_me);  

  return true;
}